

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createBinOp(Builder *this,Op opCode,Id typeId,Id left,Id right)

{
  Block *this_00;
  value_type vVar1;
  value_type vVar2;
  Id resultId;
  reference pvVar3;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_88;
  Instruction *local_80;
  Instruction *op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  allocator_type local_41;
  undefined1 local_40 [8];
  Vector<Id> operands;
  Id right_local;
  Id left_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = right;
  operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = left;
  if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    this_01 = (Instruction *)
              Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,opCode));
    resultId = getUniqueId(this);
    Instruction::Instruction(this_01,resultId,typeId,opCode);
    local_80 = this_01;
    Instruction::addIdOperand
              (this_01,operands.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    Instruction::addIdOperand
              (local_80,(Id)operands.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = this->buildPoint;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_88,
               local_80);
    Block::addInstruction(this_00,&local_88);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_88);
    this_local._4_4_ = Instruction::getResultId(local_80);
  }
  else {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_40,2,
               &local_41);
    vVar2 = operands.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    pvVar3 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_40,0);
    vVar1 = (Id)operands.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    *pvVar3 = vVar2;
    pvVar3 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_40,1);
    *pvVar3 = vVar1;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_68);
    this_local._4_4_ =
         createSpecConstantOp
                   (this,opCode,typeId,
                    (vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_40,
                    &local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_68);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createBinOp(Op opCode, Id typeId, Id left, Id right)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        dxil_spv::Vector<Id> operands(2);
        operands[0] = left; operands[1] = right;
        return createSpecConstantOp(opCode, typeId, operands, dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(left);
    op->addIdOperand(right);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}